

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

string * __thiscall
cmCTestTestHandler::GetTestStatus_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestTestHandler *this,cmCTestTestResult *result)

{
  uint uVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  uVar1 = result->Status;
  if ((ulong)uVar1 < 10) {
    if (uVar1 == 6) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&result->ExceptionStatus);
      return __return_storage_ptr__;
    }
    __s = _ZZN18cmCTestTestHandler13GetTestStatusB5cxx11ERKNS_17cmCTestTestResultEE8statuses_rel +
          *(int *)(
                  _ZZN18cmCTestTestHandler13GetTestStatusB5cxx11ERKNS_17cmCTestTestResultEE8statuses_rel
                  + (ulong)uVar1 * 4);
    __a = &local_a;
  }
  else {
    __s = "No Status";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestTestHandler::GetTestStatus(cmCTestTestResult const& result)
{
  static const char* statuses[] = { "Not Run",     "Timeout",   "SEGFAULT",
                                    "ILLEGAL",     "INTERRUPT", "NUMERICAL",
                                    "OTHER_FAULT", "Failed",    "BAD_COMMAND",
                                    "Completed" };
  int status = result.Status;
  if (status < cmCTestTestHandler::NOT_RUN ||
      status > cmCTestTestHandler::COMPLETED) {
    return "No Status";
  }
  if (status == cmCTestTestHandler::OTHER_FAULT) {
    return result.ExceptionStatus;
  }
  return statuses[status];
}